

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

void __thiscall
CppLogger::CppLogger::setFormat
          (CppLogger *this,initializer_list<CppLogger::FormatAttribute> t_Format)

{
  FormatAttribute *pFVar1;
  FormatAttribute *pFVar2;
  long lVar3;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_48;
  
  pFVar1 = t_Format._M_array + t_Format._M_len;
  local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  pFVar2 = std::
           __find_if<CppLogger::FormatAttribute_const*,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                     (t_Format._M_array,pFVar1);
  lVar3 = 0;
  if (pFVar2 == pFVar1) {
    for (; lVar3 != 0x78; lVar3 = lVar3 + 0x18) {
      Format::Format((Format *)&local_48,t_Format);
      std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      operator=((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                (&this->field_0x28 + lVar3),
                (vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                &local_48);
      std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      ~_Vector_base(&local_48);
      Format::addMessage((Format *)(&this->field_0x28 + lVar3));
    }
  }
  else {
    for (; lVar3 != 0x78; lVar3 = lVar3 + 0x18) {
      Format::Format((Format *)&local_48,t_Format);
      std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      operator=((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                (&this->field_0x28 + lVar3),
                (vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                &local_48);
      std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      ~_Vector_base(&local_48);
    }
  }
  return;
}

Assistant:

void CppLogger::setFormat(std::initializer_list<FormatAttribute> t_Format) {
        if (std::find(t_Format.begin(), t_Format.end(), FormatAttribute::Message) == t_Format.end()) {
            for(auto &format : m_Format) {
                format = t_Format;
                format.addMessage();
            }
        } else {
            for (auto &format: m_Format)
                format = t_Format;
        }
    }